

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::deepCopy(Buffer *this,Buffer *that)

{
  bool bVar1;
  off_t oVar2;
  char *pcVar3;
  char *__src;
  size_t __n;
  ulong uVar4;
  Buffer *that_local;
  Buffer *this_local;
  
  if (this != that) {
    bVar1 = empty(that);
    if (bVar1) {
      retrieve(this);
    }
    else {
      resetBuffer(this);
      oVar2 = size(that);
      this->capacity_ = oVar2;
      uVar4 = this->capacity_;
      if ((long)uVar4 < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pcVar3 = (char *)operator_new__(uVar4);
      this->buffer_ = pcVar3;
      pcVar3 = this->buffer_;
      __src = data(that);
      __n = size(that);
      memcpy(pcVar3,__src,__n);
      this->leftIndex_ = 0;
      oVar2 = size(that);
      this->rightIndex_ = oVar2;
    }
  }
  return;
}

Assistant:

void Buffer::deepCopy(const Buffer &that) {
    if (this == &that)
        return;
    if(that.empty()) {
        retrieve();
        return;
    }
    resetBuffer();
    capacity_ = that.size() + defaultPrependSize;
    buffer_ = new char[capacity_];
    ::memcpy(buffer_ + defaultPrependSize, that.data(), that.size());
    leftIndex_ = defaultPrependSize;
    rightIndex_ = that.size() + defaultPrependSize;
}